

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O0

bool __thiscall unodb::optimistic_lock::check(optimistic_lock *this,version_type locked_version)

{
  bool bVar1;
  version_type other;
  bool result;
  optimistic_lock *this_local;
  version_type locked_version_local;
  memory_order __b;
  
  this_local = (optimistic_lock *)locked_version.version;
  std::operator&(acquire,__memory_order_mask);
  locked_version_local.version = (this->read_lock_count).super___atomic_base<long>._M_i;
  if (0 < (long)locked_version_local.version) {
    other = atomic_version_type::load_relaxed(&this->version);
    bVar1 = version_type::operator==((version_type *)&this_local,other);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      dec_read_lock_count(this);
    }
    return bVar1;
  }
  __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
}

Assistant:

[[nodiscard]] bool check(version_type locked_version) const noexcept {
    UNODB_DETAIL_ASSERT(read_lock_count.load(std::memory_order_acquire) > 0);

#ifndef UNODB_DETAIL_THREAD_SANITIZER
    std::atomic_thread_fence(std::memory_order_acquire);
#endif
    const auto result{locked_version == version.load_relaxed()};
#ifndef NDEBUG
    if (UNODB_DETAIL_UNLIKELY(!result)) dec_read_lock_count();
#endif
    return UNODB_DETAIL_LIKELY(result);
  }